

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O0

int duckdb_brotli::BrotliDecoderStateInit
              (BrotliDecoderStateInternal *s,brotli_alloc_func alloc_func,brotli_free_func free_func
              ,void *opaque)

{
  BrotliSharedDictionaryInternal *pBVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  void *in_RSI;
  brotli_free_func in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RSI == (void *)0x0) {
    *(code **)(in_RDI + 0x30) = BrotliDefaultAllocFunc;
    *(code **)(in_RDI + 0x38) = BrotliDefaultFreeFunc;
    *(undefined8 *)(in_RDI + 0x40) = 0;
  }
  else {
    *(void **)(in_RDI + 0x30) = in_RSI;
    *(undefined8 *)(in_RDI + 0x38) = in_RDX;
    *(undefined8 *)(in_RDI + 0x40) = in_RCX;
  }
  *(undefined4 *)(in_RDI + 0x80) = 0;
  BrotliInitBitReader((BrotliBitReader *)(in_RDI + 8));
  *(undefined4 *)in_RDI = 0;
  *(uint *)(in_RDI + 0x304) = *(uint *)(in_RDI + 0x304) & 0xffffffdf;
  *(undefined4 *)(in_RDI + 0x2f0) = 0;
  *(undefined4 *)(in_RDI + 0x2f4) = 0;
  *(undefined4 *)(in_RDI + 0x2f8) = 0;
  *(undefined4 *)(in_RDI + 0x2fc) = 0;
  *(undefined8 *)(in_RDI + 0x50) = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined4 *)(in_RDI + 0x58) = 0;
  *(undefined8 *)(in_RDI + 0x1a8) = 0;
  *(undefined8 *)(in_RDI + 0x1b0) = 0;
  *(undefined8 *)(in_RDI + 0x2e8) = 0;
  *(undefined8 *)(in_RDI + 0x100) = 0;
  *(undefined8 *)(in_RDI + 0x108) = 0;
  *(undefined8 *)(in_RDI + 0x88) = 0;
  *(undefined4 *)(in_RDI + 100) = 0;
  *(undefined4 *)(in_RDI + 0x300) = 0;
  *(undefined4 *)(in_RDI + 0x68) = 0;
  *(undefined8 *)(in_RDI + 0x310) = 0;
  *(undefined8 *)(in_RDI + 0x318) = 0;
  *(undefined8 *)(in_RDI + 0x198) = 0;
  *(undefined8 *)(in_RDI + 0xa8) = 0;
  *(undefined8 *)(in_RDI + 0xb0) = 0;
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  *(undefined8 *)(in_RDI + 0xb8) = 0;
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  *(undefined8 *)(in_RDI + 0xd0) = 0;
  *(undefined8 *)(in_RDI + 0xf0) = 0;
  *(undefined8 *)(in_RDI + 0xe8) = 0;
  *(uint *)(in_RDI + 0x304) = *(uint *)(in_RDI + 0x304) & 0xfffffffe;
  *(uint *)(in_RDI + 0x304) = *(uint *)(in_RDI + 0x304) & 0xfffffffd;
  *(uint *)(in_RDI + 0x304) = *(uint *)(in_RDI + 0x304) & 0xfffffffb;
  *(uint *)(in_RDI + 0x304) = *(uint *)(in_RDI + 0x304) & 0xfffffff7;
  *(uint *)(in_RDI + 0x304) = *(uint *)(in_RDI + 0x304) & 0xffffffef | 0x10;
  *(uint *)(in_RDI + 0x304) = *(uint *)(in_RDI + 0x304) & 0xfffff03f;
  *(undefined4 *)(in_RDI + 0x60) = 0;
  *(undefined4 *)(in_RDI + 0x70) = 0x10;
  *(undefined4 *)(in_RDI + 0x74) = 0xf;
  *(undefined4 *)(in_RDI + 0x78) = 0xb;
  *(undefined4 *)(in_RDI + 0x7c) = 4;
  *(undefined4 *)(in_RDI + 0x6c) = 0;
  *(undefined8 *)(in_RDI + 0x100) = 0;
  *(undefined8 *)(in_RDI + 0x108) = 0;
  *(undefined8 *)(in_RDI + 0x1b8) = 0x3f;
  *(undefined8 *)(in_RDI + 0x328) = 0;
  pBVar1 = BrotliSharedDictionaryCreateInstance
                     ((brotli_alloc_func)
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI);
  *(BrotliSharedDictionaryInternal **)(in_RDI + 800) = pBVar1;
  if (*(long *)(in_RDI + 800) != 0) {
    *(undefined8 *)(in_RDI + 0x2d0) = 0;
    *(undefined8 *)(in_RDI + 0x2d8) = 0;
    *(undefined8 *)(in_RDI + 0x2e0) = 0;
  }
  return (uint)(*(long *)(in_RDI + 800) != 0);
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliDecoderStateInit(BrotliDecoderState* s,
    brotli_alloc_func alloc_func, brotli_free_func free_func, void* opaque) {
  if (!alloc_func) {
    s->alloc_func = BrotliDefaultAllocFunc;
    s->free_func = BrotliDefaultFreeFunc;
    s->memory_manager_opaque = 0;
  } else {
    s->alloc_func = alloc_func;
    s->free_func = free_func;
    s->memory_manager_opaque = opaque;
  }

  s->error_code = 0; /* BROTLI_DECODER_NO_ERROR */

  BrotliInitBitReader(&s->br);
  s->state = BROTLI_STATE_UNINITED;
  s->large_window = 0;
  s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
  s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_NONE;
  s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
  s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;

  s->buffer_length = 0;
  s->loop_counter = 0;
  s->pos = 0;
  s->rb_roundtrips = 0;
  s->partial_pos_out = 0;
  s->used_input = 0;

  s->block_type_trees = NULL;
  s->block_len_trees = NULL;
  s->ringbuffer = NULL;
  s->ringbuffer_size = 0;
  s->new_ringbuffer_size = 0;
  s->ringbuffer_mask = 0;

  s->context_map = NULL;
  s->context_modes = NULL;
  s->dist_context_map = NULL;
  s->context_map_slice = NULL;
  s->dist_context_map_slice = NULL;

  s->literal_hgroup.codes = NULL;
  s->literal_hgroup.htrees = NULL;
  s->insert_copy_hgroup.codes = NULL;
  s->insert_copy_hgroup.htrees = NULL;
  s->distance_hgroup.codes = NULL;
  s->distance_hgroup.htrees = NULL;

  s->is_last_metablock = 0;
  s->is_uncompressed = 0;
  s->is_metadata = 0;
  s->should_wrap_ringbuffer = 0;
  s->canny_ringbuffer_allocation = 1;

  s->window_bits = 0;
  s->max_distance = 0;
  s->dist_rb[0] = 16;
  s->dist_rb[1] = 15;
  s->dist_rb[2] = 11;
  s->dist_rb[3] = 4;
  s->dist_rb_idx = 0;
  s->block_type_trees = NULL;
  s->block_len_trees = NULL;

  s->mtf_upper_bound = 63;

  s->compound_dictionary = NULL;
  s->dictionary =
      BrotliSharedDictionaryCreateInstance(alloc_func, free_func, opaque);
  if (!s->dictionary) return BROTLI_FALSE;

  s->metadata_start_func = NULL;
  s->metadata_chunk_func = NULL;
  s->metadata_callback_opaque = 0;

  return BROTLI_TRUE;
}